

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar9;
  Fad<double> *pFVar10;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar11;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar12;
  uint uVar13;
  ulong uVar14;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar15;
  value_type vVar16;
  
  pFVar15 = (fadexpr->fadexpr_).right_;
  pFVar11 = (pFVar15->fadexpr_).left_;
  pFVar12 = (pFVar11->fadexpr_).left_;
  pFVar9 = (pFVar12->fadexpr_).left_;
  pFVar10 = *(Fad<double> **)((long)&pFVar9->fadexpr_ + 0x10);
  uVar13 = (pFVar10->dx_).num_elts;
  uVar1 = (((pFVar12->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar13) {
    uVar1 = uVar13;
  }
  uVar2 = (((pFVar11->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 <= (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00fbc326;
    pdVar8 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00fbc326;
    }
    if (uVar2 != 0) {
      pdVar8 = (this->dx_).ptr_to_data;
      if (pdVar8 != (double *)0x0) {
        operator_delete__(pdVar8);
        pFVar15 = (fadexpr->fadexpr_).right_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar14 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar14 = (ulong)uVar1 << 3;
    }
    pdVar8 = (double *)operator_new__(uVar14);
    (this->dx_).ptr_to_data = pdVar8;
    pFVar11 = (pFVar15->fadexpr_).left_;
    pFVar12 = (pFVar11->fadexpr_).left_;
    pFVar9 = (pFVar12->fadexpr_).left_;
    pFVar10 = *(Fad<double> **)((long)&pFVar9->fadexpr_ + 0x10);
    uVar13 = (pFVar10->dx_).num_elts;
  }
  if (((uVar13 == 0) || (pFVar3 = (pFVar12->fadexpr_).right_, (pFVar3->dx_).num_elts == 0)) ||
     (pFVar4 = (pFVar11->fadexpr_).right_, (pFVar4->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      uVar14 = 0;
      do {
        vVar16 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
                 ::dx(&((((fadexpr->fadexpr_).right_)->fadexpr_).left_)->fadexpr_,(int)uVar14);
        pdVar8[uVar14] = vVar16 * (fadexpr->fadexpr_).left_.constant_;
        uVar14 = uVar14 + 1;
      } while (uVar1 != uVar14);
    }
  }
  else if (0 < (int)uVar1) {
    pdVar5 = *(double **)((long)&pFVar10->dx_ + 8);
    pdVar6 = (pFVar3->dx_).ptr_to_data;
    pdVar7 = (pFVar4->dx_).ptr_to_data;
    uVar14 = 0;
    do {
      pdVar8[uVar14] =
           (pdVar5[uVar14] * (pFVar9->fadexpr_).left_.constant_ + pdVar6[uVar14] + pdVar7[uVar14]) *
           (fadexpr->fadexpr_).left_.constant_;
      uVar14 = uVar14 + 1;
    } while (uVar1 != uVar14);
  }
LAB_00fbc326:
  pFVar15 = (fadexpr->fadexpr_).right_;
  pFVar11 = (pFVar15->fadexpr_).left_;
  pFVar12 = (pFVar11->fadexpr_).left_;
  pFVar9 = (pFVar12->fadexpr_).left_;
  this->val_ = (((pFVar9->fadexpr_).left_.constant_ *
                 (*(Fad<double> **)((long)&pFVar9->fadexpr_ + 0x10))->val_ +
                 ((pFVar12->fadexpr_).right_)->val_ + ((pFVar11->fadexpr_).right_)->val_) -
               (pFVar15->fadexpr_).right_.constant_) * (fadexpr->fadexpr_).left_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}